

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O2

KeySym anon_unknown.dwarf_278bfb::scancodeToKeySym(Scancode code)

{
  KeyCode KVar1;
  Display *display;
  KeySym KVar2;
  
  display = sf::priv::OpenDisplay();
  KVar1 = scancodeToKeyCode(code);
  if (KVar1 == '\0') {
    KVar2 = 0;
  }
  else {
    KVar2 = XkbKeycodeToKeysym(display,KVar1,0,0);
  }
  sf::priv::CloseDisplay(display);
  return KVar2;
}

Assistant:

KeySym scancodeToKeySym(sf::Keyboard::Scancode code)
{
    Display* display = sf::priv::OpenDisplay();

    KeySym keysym = NoSymbol;
    KeyCode keycode = scancodeToKeyCode(code);

    if (keycode != NullKeyCode) // ensure that this Scancode is mapped to keycode
        keysym = XkbKeycodeToKeysym(display, keycode, 0, 0);

    sf::priv::CloseDisplay(display);

    return keysym;
}